

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O2

void __thiscall game::game(game *this)

{
  (this->boards).BQ = 0;
  (this->boards).BK = 0;
  (this->boards).BB = 0;
  (this->boards).BR = 0;
  (this->boards).BP = 0;
  (this->boards).BN = 0;
  (this->boards).WQ = 0;
  (this->boards).WK = 0;
  (this->boards).WB = 0;
  (this->boards).WR = 0;
  (this->boards).WP = 0;
  (this->boards).WN = 0;
  (this->boards).castleInfo.whiteACan = true;
  (this->boards).castleInfo.whiteHCan = true;
  (this->boards).castleInfo.blackACan = true;
  (this->boards).castleInfo.blackHCan = true;
  std::stack<bitboards,std::deque<bitboards,std::allocator<bitboards>>>::
  stack<std::deque<bitboards,std::allocator<bitboards>>,void>(&this->boardHistory);
  std::stack<move,std::deque<move,std::allocator<move>>>::
  stack<std::deque<move,std::allocator<move>>,void>(&this->history);
  this->blacksTurn = false;
  bitboards::initStandardBoard(&this->boards);
  return;
}

Assistant:

game() {
    boards.initStandardBoard();
  }